

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cc
# Opt level: O0

int strlcpy_int(char *dst,char *src,int dst_size)

{
  size_t sVar1;
  size_t local_48;
  size_t ret;
  int dst_size_local;
  char *src_local;
  char *dst_local;
  
  if (dst_size < 0) {
    local_48 = 0;
  }
  else {
    local_48 = (size_t)dst_size;
  }
  sVar1 = OPENSSL_strlcpy(dst,src,local_48);
  if (sVar1 < 0x80000000) {
    dst_local._4_4_ = (int)sVar1;
  }
  else {
    ERR_put_error(8,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/obj/obj.cc"
                  ,0x180);
    dst_local._4_4_ = -1;
  }
  return dst_local._4_4_;
}

Assistant:

static int strlcpy_int(char *dst, const char *src, int dst_size) {
  size_t ret = OPENSSL_strlcpy(dst, src, dst_size < 0 ? 0 : (size_t)dst_size);
  if (ret > INT_MAX) {
    OPENSSL_PUT_ERROR(OBJ, ERR_R_OVERFLOW);
    return -1;
  }
  return (int)ret;
}